

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O1

int TvCtrlPointDeleteNode(TvDeviceNode *node)

{
  uint uVar1;
  char **ppcVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  
  if (node == (TvDeviceNode *)0x0) {
    SampleUtil_Print("ERROR: TvCtrlPointDeleteNode: Node is empty\n");
    iVar5 = -1;
  }
  else {
    ppcVar2 = (node->device).TvService[0].VariableStrVal;
    lVar6 = 0;
    do {
      if ((node->device).TvService[lVar6].SID[0] != '\0') {
        pcVar3 = (node->device).TvService[lVar6].SID;
        uVar1 = UpnpUnSubscribe(ctrlpt_handle,pcVar3);
        if (uVar1 == 0) {
          SampleUtil_Print("Unsubscribed from Tv %s EventURL with SID=%s\n",TvServiceName[lVar6],
                           pcVar3);
        }
        else {
          SampleUtil_Print("Error unsubscribing to Tv %s EventURL -- %d\n",TvServiceName[lVar6],
                           (ulong)uVar1);
        }
      }
      if ('\0' < TvVarCount[lVar6]) {
        lVar4 = 0;
        do {
          if (ppcVar2[lVar4] != (char *)0x0) {
            free(ppcVar2[lVar4]);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < TvVarCount[lVar6]);
      }
      ppcVar2 = ppcVar2 + 0xa4;
      bVar7 = lVar6 == 0;
      lVar6 = lVar6 + 1;
    } while (bVar7);
    iVar5 = 0;
    SampleUtil_StateUpdate((char *)0x0,(char *)0x0,(char *)node,DEVICE_REMOVED);
    free(node);
  }
  return iVar5;
}

Assistant:

int TvCtrlPointDeleteNode(struct TvDeviceNode *node)
{
	int rc, service, var;

	if (NULL == node) {
		SampleUtil_Print(
			"ERROR: TvCtrlPointDeleteNode: Node is empty\n");
		return TV_ERROR;
	}

	for (service = 0; service < TV_SERVICE_SERVCOUNT; service++) {
		/*
		   If we have a valid control SID, then unsubscribe
		 */
		if (strcmp(node->device.TvService[service].SID, "") != 0) {
			rc = UpnpUnSubscribe(ctrlpt_handle,
				node->device.TvService[service].SID);
			if (UPNP_E_SUCCESS == rc) {
				SampleUtil_Print("Unsubscribed from Tv %s "
						 "EventURL with SID=%s\n",
					TvServiceName[service],
					node->device.TvService[service].SID);
			} else {
				SampleUtil_Print("Error unsubscribing to Tv %s "
						 "EventURL -- %d\n",
					TvServiceName[service],
					rc);
			}
		}

		for (var = 0; var < TvVarCount[service]; var++) {
			if (node->device.TvService[service]
					.VariableStrVal[var]) {
				free(node->device.TvService[service]
						.VariableStrVal[var]);
			}
		}
	}

	/*Notify New Device Added */
	SampleUtil_StateUpdate(NULL, NULL, node->device.UDN, DEVICE_REMOVED);
	free(node);
	node = NULL;

	return TV_SUCCESS;
}